

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::BufferTestUtil::IndexArrayVerifier::verify
          (IndexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  CallLogWrapper *pCVar1;
  long *plVar2;
  byte bVar3;
  RenderContext *pRVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  void *__s;
  void *__s_00;
  long lVar8;
  undefined8 *puVar9;
  TextureFormat *pTVar10;
  byte *pbVar11;
  long lVar12;
  TextureFormat TVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  void *pvVar17;
  uint uVar18;
  pointer pVVar19;
  int height;
  uint count;
  float fVar20;
  float fVar21;
  string imageSetDesc;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> colors;
  RGBA threshold;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  Surface referenceImg;
  Surface indexBufferImg;
  Random rnd;
  uint local_314;
  TextureFormat local_308;
  TextureFormat local_300;
  ulong local_2f8;
  TextureFormat TStack_2f0;
  long *local_2e8;
  undefined8 local_2e0;
  long local_2d8;
  undefined8 uStack_2d0;
  long *local_2c8;
  undefined8 local_2c0;
  long local_2b8;
  undefined8 uStack_2b0;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_2a8;
  int local_284;
  int local_280;
  RGBA local_27c;
  ulong *local_278;
  long local_270;
  ulong local_268 [2];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_258;
  ulong *local_240;
  long local_238;
  ulong local_230 [2];
  ulong *local_220;
  long local_218;
  ulong local_210 [2];
  uchar *local_200;
  size_t local_1f8;
  uchar *local_1f0;
  CallLogWrapper *local_1e8;
  ulong local_1e0;
  Surface local_1d8;
  Surface local_1c0;
  PixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  
  local_200 = sig;
  local_1f8 = siglen;
  local_1f0 = tbs;
  iVar6 = (*((this->super_BufferVerifierBase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar14 = *(int *)CONCAT44(extraout_var,iVar6);
  if (0x7f < iVar14) {
    iVar14 = 0x80;
  }
  iVar6 = ((int *)CONCAT44(extraout_var,iVar6))[1];
  height = 0x80;
  if (iVar6 < 0x80) {
    height = iVar6;
  }
  local_27c.m_value = 0;
  local_258.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = operator_new(0x408);
  memset(__s,0,0x408);
  __s_00 = operator_new(0x60c);
  memset(__s_00,0,0x60c);
  tcu::Surface::Surface(&local_1c0,iVar14,height);
  tcu::Surface::Surface(&local_1d8,iVar14,height);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_258,0x100);
  lVar8 = 4;
  lVar12 = 0;
  do {
    fVar20 = (float)(int)lVar12 / 15.0;
    lVar15 = 0;
    do {
      fVar21 = (float)(int)lVar15 / 15.0;
      *(float *)((long)local_258.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar15].m_data + lVar8 + -4) =
           fVar21 + fVar21 + -1.0;
      *(float *)((long)local_258.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar15].m_data + lVar8) =
           fVar20 + fVar20 + -1.0;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x10);
    lVar12 = lVar12 + 1;
    lVar8 = lVar8 + 0x80;
  } while (lVar12 != 0x10);
  deRandom_init((deRandom *)local_1a8,0xabc231);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::resize
            (&local_2a8,0x100);
  if (local_2a8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_2a8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar19 = local_2a8.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      fVar20 = deRandom_getFloat((deRandom *)local_1a8);
      pVVar19->m_data[0] = fVar20 * 0.4 + 0.1;
      fVar20 = deRandom_getFloat((deRandom *)local_1a8);
      pVVar19->m_data[1] = fVar20 * 0.4 + 0.1;
      fVar20 = deRandom_getFloat((deRandom *)local_1a8);
      pVVar19->m_data[2] = fVar20 * 0.4 + 0.1;
      pVVar19 = pVVar19 + 1;
    } while (pVVar19 !=
             local_2a8.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pCVar1 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,0);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8893,(GLuint)ctx);
  glu::CallLogWrapper::glViewport(pCVar1,0,0,iVar14,height);
  glu::CallLogWrapper::glClearColor(pCVar1,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(pCVar1,(this->m_program->m_program).m_program);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_posLoc);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_colorLoc);
  glu::CallLogWrapper::glEnable(pCVar1,0xbe2);
  glu::CallLogWrapper::glBlendFunc(pCVar1,1,1);
  glu::CallLogWrapper::glBlendEquation(pCVar1,0x8006);
  local_284 = (int)local_1f0 + -2;
  local_200 = local_200 + (int)local_1f8;
  local_314 = (uint)CONCAT71((int7)(int3)(local_1f8 >> 8),1);
  iVar14 = 0;
  local_1e8 = pCVar1;
  do {
    uVar7 = (int)local_1f0 - iVar14;
    if (uVar7 == 0 || (int)local_1f0 < iVar14) break;
    uVar18 = 0x81;
    if ((int)uVar7 < 0x81) {
      uVar18 = uVar7;
    }
    count = 2;
    if (2 < (int)uVar18) {
      count = uVar18;
    }
    iVar6 = iVar14;
    if ((int)uVar7 < 2) {
      iVar6 = local_284;
      uVar18 = uVar7;
    }
    local_278 = local_268;
    local_280 = iVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Bytes ","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    uVar7 = iVar6 + (int)local_1f8;
    local_1e0 = (ulong)uVar7;
    std::ostream::operator<<((ostringstream *)local_1a8,uVar7);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar16 = 0xf;
    if (local_278 != local_268) {
      uVar16 = local_268[0];
    }
    if (uVar16 < (ulong)(local_218 + local_270)) {
      uVar16 = 0xf;
      if (local_220 != local_210) {
        uVar16 = local_210[0];
      }
      if (uVar16 < (ulong)(local_218 + local_270)) goto LAB_003f905c;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_278);
    }
    else {
LAB_003f905c:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_220);
    }
    local_2e8 = &local_2d8;
    plVar2 = puVar9 + 2;
    if ((long *)*puVar9 == plVar2) {
      local_2d8 = *plVar2;
      uStack_2d0 = puVar9[3];
    }
    else {
      local_2d8 = *plVar2;
      local_2e8 = (long *)*puVar9;
    }
    local_2e0 = puVar9[1];
    *puVar9 = plVar2;
    puVar9[1] = 0;
    *(undefined1 *)plVar2 = 0;
    pTVar10 = (TextureFormat *)std::__cxx11::string::append((char *)&local_2e8);
    local_308 = (TextureFormat)&local_2f8;
    TVar13 = (TextureFormat)(pTVar10 + 2);
    if (*pTVar10 == TVar13) {
      local_2f8 = *(ulong *)TVar13;
      TStack_2f0 = pTVar10[3];
    }
    else {
      local_2f8 = *(ulong *)TVar13;
      local_308 = *pTVar10;
    }
    local_300 = pTVar10[1];
    *pTVar10 = TVar13;
    pTVar10[1].order = R;
    pTVar10[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar10[2].order = R;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<((ostringstream *)local_1a8,count + (int)local_1e0 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar16 = 0xf;
    if (local_308 != (TextureFormat)&local_2f8) {
      uVar16 = local_2f8;
    }
    if (uVar16 < (ulong)(local_238 + (long)local_300)) {
      uVar16 = 0xf;
      if (local_240 != local_230) {
        uVar16 = local_230[0];
      }
      if (uVar16 < (ulong)(local_238 + (long)local_300)) goto LAB_003f91d2;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_308);
    }
    else {
LAB_003f91d2:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_240);
    }
    local_2c8 = &local_2b8;
    plVar2 = puVar9 + 2;
    if ((long *)*puVar9 == plVar2) {
      local_2b8 = *plVar2;
      uStack_2b0 = puVar9[3];
    }
    else {
      local_2b8 = *plVar2;
      local_2c8 = (long *)*puVar9;
    }
    local_2c0 = puVar9[1];
    *puVar9 = plVar2;
    puVar9[1] = 0;
    *(undefined1 *)plVar2 = 0;
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if (local_308 != (TextureFormat)&local_2f8) {
      operator_delete((void *)local_308,local_2f8 + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if (local_220 != local_210) {
      operator_delete(local_220,local_210[0] + 1);
    }
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    pCVar1 = local_1e8;
    glu::CallLogWrapper::glClear(local_1e8,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (pCVar1,this->m_posLoc,2,0x1406,'\0',0,
               local_258.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glVertexAttribPointer
              (pCVar1,this->m_colorLoc,3,0x1406,'\0',0,
               local_2a8.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glDrawElements(pCVar1,3,count,0x1401,(void *)(long)(int)local_1e0);
    pRVar4 = ((this->super_BufferVerifierBase).m_context)->m_renderCtx;
    local_308.order = RGBA;
    local_308.type = UNORM_INT8;
    pvVar17 = (void *)local_1c0.m_pixels.m_cap;
    if ((void *)local_1c0.m_pixels.m_cap != (void *)0x0) {
      pvVar17 = local_1c0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (local_1a8,&local_308,local_1c0.m_width,local_1c0.m_height,1,pvVar17);
    glu::readPixels(pRVar4,0,0,local_1a8);
    pCVar1 = local_1e8;
    pbVar11 = local_200 + iVar6;
    uVar16 = 0;
    do {
      *(undefined8 *)((long)__s + uVar16 * 8) =
           *(undefined8 *)
            local_258.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[pbVar11[uVar16]].m_data;
      uVar16 = uVar16 + 1;
    } while (count != uVar16);
    lVar8 = 0;
    do {
      bVar3 = *pbVar11;
      *(float *)((long)__s_00 + lVar8 + 8) =
           local_2a8.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[bVar3].m_data[2];
      *(undefined8 *)((long)__s_00 + lVar8) =
           *(undefined8 *)
            local_2a8.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start[bVar3].m_data;
      lVar8 = lVar8 + 0xc;
      pbVar11 = pbVar11 + 1;
    } while ((ulong)count * 0xc != lVar8);
    glu::CallLogWrapper::glClear(local_1e8,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_posLoc,2,0x1406,'\0',0,__s);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_colorLoc,3,0x1406,'\0',0,__s_00);
    glu::CallLogWrapper::glDrawArrays(pCVar1,3,0,count);
    pRVar4 = ((this->super_BufferVerifierBase).m_context)->m_renderCtx;
    local_308.order = RGBA;
    local_308.type = UNORM_INT8;
    pvVar17 = (void *)local_1d8.m_pixels.m_cap;
    if ((void *)local_1d8.m_pixels.m_cap != (void *)0x0) {
      pvVar17 = local_1d8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (local_1a8,&local_308,local_1d8.m_width,local_1d8.m_height,1,pvVar17);
    glu::readPixels(pRVar4,0,0,local_1a8);
    bVar5 = tcu::pixelThresholdCompare
                      (((this->super_BufferVerifierBase).m_context)->m_testCtx->m_log,"RenderResult"
                       ,(char *)local_2c8,&local_1d8,&local_1c0,&local_27c,COMPARE_LOG_RESULT);
    local_314 = local_314 & 0xff;
    if (!bVar5) {
      local_314 = 0;
      uVar18 = 0;
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    iVar14 = local_280 + uVar18;
  } while (bVar5);
  tcu::Surface::~Surface(&local_1d8);
  tcu::Surface::~Surface(&local_1c0);
  operator_delete(__s_00,0x60c);
  operator_delete(__s,0x408);
  if (local_2a8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_314;
}

Assistant:

bool IndexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					viewportW			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_WIDTH, renderTarget.getWidth());
	const int					viewportH			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_HEIGHT, renderTarget.getHeight());
	const int					minBytesPerBatch	= 2;
	const tcu::RGBA				threshold			(0,0,0,0);

	std::vector<tcu::Vec2>		positions;
	std::vector<tcu::Vec3>		colors;

	std::vector<tcu::Vec2>		fetchedPos			(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);
	std::vector<tcu::Vec3>		fetchedColor		(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);

	tcu::Surface				indexBufferImg		(viewportW, viewportH);
	tcu::Surface				referenceImg		(viewportW, viewportH);

	int							numVerified			= 0;
	bool						isOk				= true;

	DE_STATIC_ASSERT(sizeof(tcu::Vec2) == sizeof(float)*2);
	DE_STATIC_ASSERT(sizeof(tcu::Vec3) == sizeof(float)*3);

	computeIndexVerifierPositions(positions);
	computeIndexVerifierColors(colors);

	// Reset buffer bindings.
	glBindBuffer				(GL_ARRAY_BUFFER,			0);
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	buffer);

	// Setup rendering state.
	glViewport					(0, 0, viewportW, viewportH);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(m_posLoc);
	glEnableVertexAttribArray	(m_colorLoc);
	glEnable					(GL_BLEND);
	glBlendFunc					(GL_ONE, GL_ONE);
	glBlendEquation				(GL_FUNC_ADD);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < minBytesPerBatch;
		int		numBytesToVerify	= isLeftoverBatch ? minBytesPerBatch			: de::min(MAX_LINES_PER_INDEX_ARRAY_DRAW+1, numRemaining);
		int		curOffset			= isLeftoverBatch ? (numBytes-minBytesPerBatch)	: numVerified;
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		// Step 1: Render using index buffer.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &positions[0]);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, &colors[0]);
		glDrawElements			(GL_LINE_STRIP, numBytesToVerify, GL_UNSIGNED_BYTE, (void*)(deUintptr)(offset+curOffset));
		glu::readPixels			(m_context.getRenderContext(), 0, 0, indexBufferImg.getAccess());

		// Step 2: Do manual fetch and render without index buffer.
		execVertexFetch(&fetchedPos[0], &positions[0], refPtr+offset+curOffset, numBytesToVerify);
		execVertexFetch(&fetchedColor[0], &colors[0], refPtr+offset+curOffset, numBytesToVerify);

		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &fetchedPos[0]);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, &fetchedColor[0]);
		glDrawArrays			(GL_LINE_STRIP, 0, numBytesToVerify);
		glu::readPixels			(m_context.getRenderContext(), 0, 0, referenceImg.getAccess());

		if (!tcu::pixelThresholdCompare(m_context.getTestContext().getLog(), "RenderResult", imageSetDesc.c_str(), referenceImg, indexBufferImg, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	return isOk;
}